

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void AYUVToUVRow_C(uint8_t *src_ayuv,int src_stride_ayuv,uint8_t *dst_uv,int width)

{
  int x;
  int width_local;
  uint8_t *dst_uv_local;
  int src_stride_ayuv_local;
  uint8_t *src_ayuv_local;
  
  dst_uv_local = dst_uv;
  src_ayuv_local = src_ayuv;
  for (x = 0; x < width; x = x + 2) {
    *dst_uv_local =
         (uint8_t)((int)((uint)src_ayuv_local[1] + (uint)src_ayuv_local[5] +
                         (uint)src_ayuv_local[src_stride_ayuv + 1] +
                         (uint)src_ayuv_local[src_stride_ayuv + 5] + 2) >> 2);
    dst_uv_local[1] =
         (uint8_t)((int)((uint)*src_ayuv_local + (uint)src_ayuv_local[4] +
                         (uint)src_ayuv_local[src_stride_ayuv] +
                         (uint)src_ayuv_local[src_stride_ayuv + 4] + 2) >> 2);
    src_ayuv_local = src_ayuv_local + 8;
    dst_uv_local = dst_uv_local + 2;
  }
  if ((width & 1U) != 0) {
    *dst_uv_local =
         (uint8_t)((int)((uint)*src_ayuv_local + (uint)*src_ayuv_local +
                         (uint)src_ayuv_local[src_stride_ayuv] +
                         (uint)src_ayuv_local[src_stride_ayuv] + 2) >> 2);
    dst_uv_local[1] =
         (uint8_t)((int)((uint)src_ayuv_local[1] + (uint)src_ayuv_local[1] +
                         (uint)src_ayuv_local[src_stride_ayuv + 1] +
                         (uint)src_ayuv_local[src_stride_ayuv + 1] + 2) >> 2);
  }
  return;
}

Assistant:

void AYUVToUVRow_C(const uint8_t* src_ayuv,
                   int src_stride_ayuv,
                   uint8_t* dst_uv,
                   int width) {
  // Output a row of UV values, filtering 2x2 rows of AYUV.
  int x;
  for (x = 0; x < width; x += 2) {
    dst_uv[0] = (src_ayuv[1] + src_ayuv[5] + src_ayuv[src_stride_ayuv + 1] +
                 src_ayuv[src_stride_ayuv + 5] + 2) >>
                2;
    dst_uv[1] = (src_ayuv[0] + src_ayuv[4] + src_ayuv[src_stride_ayuv + 0] +
                 src_ayuv[src_stride_ayuv + 4] + 2) >>
                2;
    src_ayuv += 8;
    dst_uv += 2;
  }
  if (width & 1) {
    dst_uv[0] = (src_ayuv[0] + src_ayuv[0] + src_ayuv[src_stride_ayuv + 0] +
                 src_ayuv[src_stride_ayuv + 0] + 2) >>
                2;
    dst_uv[1] = (src_ayuv[1] + src_ayuv[1] + src_ayuv[src_stride_ayuv + 1] +
                 src_ayuv[src_stride_ayuv + 1] + 2) >>
                2;
  }
}